

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_o2.cc
# Opt level: O0

MatrixXd * __thiscall
lf::geometry::QuadO2::Global(MatrixXd *__return_storage_ptr__,QuadO2 *this,MatrixXd *local)

{
  bool bVar1;
  runtime_error *this_00;
  bool local_909;
  VectorwiseOp<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> local_908;
  Nested local_900;
  NestedExpressionType local_8f8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Reverse<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>_>
  local_8f0;
  MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Reverse<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>_>_>
  local_8c8;
  Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Reverse<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>_>_>,_0>
  local_8a0;
  ConstRowXpr local_870;
  ConstRowXpr local_838;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
  local_800;
  Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_0>
  local_788;
  MatrixWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
  local_708;
  Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>,_0>
  local_6f8;
  Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_6e0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>,_0>_>
  local_6d0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>,_0>_>,_const_Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_0>_>
  local_6a0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>,_0>_>,_const_Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_0>_>,_const_Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Reverse<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>_>_>,_0>_>
  local_5e0;
  ConstColwiseReturnType local_4e0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>,_0>_>,_const_Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_0>_>,_const_Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Reverse<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>_>_>,_0>_>,_const_Eigen::Replicate<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,__1>_>
  local_3e0;
  NestedExpressionType local_2b8;
  undefined1 local_2b0 [8];
  SquareReturnType local_squared;
  allocator<char> local_279;
  string local_278;
  allocator<char> local_251;
  string local_250;
  stringstream local_220 [8];
  stringstream ss;
  ostream local_210 [376];
  Scalar local_98;
  NestedExpressionType local_90;
  CmpLEReturnType local_88;
  NestedExpressionType local_60;
  Scalar local_58;
  RCmpLEReturnType local_50;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *local_20;
  MatrixXd *local_local;
  QuadO2 *this_local;
  
  local_58 = 0.0;
  local_20 = (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local;
  local_local = (MatrixXd *)this;
  this_local = (QuadO2 *)__return_storage_ptr__;
  local_60 = (NestedExpressionType)
             Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::array
                       ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local);
  Eigen::operator<=(&local_50,&local_58,
                    (ArrayBase<Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                     *)&local_60);
  bVar1 = Eigen::
          DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
          ::all((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                 *)&local_50);
  local_909 = false;
  if (bVar1) {
    local_90 = (NestedExpressionType)
               Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::array(local_20);
    local_98 = 1.0;
    Eigen::ArrayBase<Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>::
    operator<=(&local_88,
               (ArrayBase<Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
               &local_90,&local_98);
    local_909 = Eigen::
                DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>_>_>
                ::all((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>_>_>
                       *)&local_88);
  }
  if (((local_909 ^ 0xffU) & 1) != 0) {
    std::__cxx11::stringstream::stringstream(local_220);
    std::operator<<(local_210,"local coordinates out of bounds for reference element");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_250,"(0. <= local.array()).all() && (local.array() <= 1.).all()",
               &local_251);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o2.cc"
               ,&local_279);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_250,&local_278,0x3a,(string *)&local_squared.field_0x8);
    std::__cxx11::string::~string((string *)&local_squared.field_0x8);
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator(&local_279);
    std::__cxx11::string::~string((string *)&local_250);
    std::allocator<char>::~allocator(&local_251);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"this code should not be reached");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_2b8 = (NestedExpressionType)
              Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::array(local_20);
  Eigen::ArrayBase<Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>::square
            ((SquareReturnType *)local_2b0,
             (ArrayBase<Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             &local_2b8);
  local_6e0 = Eigen::MatrixBase<Eigen::Matrix<double,-1,2,0,-1,2>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,_1,2,0,_1,2>> *)&this->beta_,local_20);
  Eigen::
  ArrayBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
  ::matrix(&local_708,
           (ArrayBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
            *)local_2b0);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,2,0,-1,2>>::operator*
            (&local_6f8,(MatrixBase<Eigen::Matrix<double,_1,2,0,_1,2>> *)&this->gamma_,
             (MatrixBase<Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
              *)&local_708);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,-1,2,0,-1,2>,Eigen::Matrix<double,-1,-1,0,-1,-1>,0>>
  ::operator+(&local_6d0,
              (MatrixBase<Eigen::Product<Eigen::Matrix<double,_1,2,0,_1,2>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
               *)&local_6e0,
              (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>,_0>_>
               *)&local_6f8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
            (&local_838,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_20,0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
            (&local_870,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_20,1);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>>::
  cwiseProduct<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>>
            (&local_800,&local_838,
             (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
              *)&local_870);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator*
            (&local_788,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&this->delta_,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
              *)&local_800);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,-1,2,0,-1,2>,Eigen::Matrix<double,-1,-1,0,-1,-1>,0>const,Eigen::Product<Eigen::Matrix<double,-1,2,0,-1,2>,Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,-1,-1,0,-1,-1>const>const>>,0>const>>
  ::operator+(&local_6a0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,2,0,_1,2>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const,Eigen::Product<Eigen::Matrix<double,_1,2,0,_1,2>,Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>,0>const>>
               *)&local_6d0,
              (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_0>_>
               *)&local_788);
  local_908.m_matrix =
       (ExpressionTypeNested)
       Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::colwise
                 ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_20);
  local_900 = (Nested)Eigen::VectorwiseOp<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                      reverse(&local_908);
  local_8f8.m_matrix =
       (Nested)Eigen::MatrixBase<Eigen::Reverse<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>_>
               ::array((MatrixBase<Eigen::Reverse<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                        *)&local_900);
  Eigen::
  ArrayBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,-1,-1,0,-1,-1>const>const>>
  ::operator*(&local_8f0,
              (ArrayBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
               *)local_2b0,
              (ArrayBase<Eigen::ArrayWrapper<const_Eigen::Reverse<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>_>
               *)&local_8f8);
  Eigen::
  ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Reverse<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>_>_>_>
  ::matrix(&local_8c8,
           (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Reverse<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>_>_>
            *)&local_8f0);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,2,0,-1,2>>::operator*
            (&local_8a0,(MatrixBase<Eigen::Matrix<double,_1,2,0,_1,2>> *)&this->epsilon_,
             (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Reverse<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>_>_>_>
              *)&local_8c8);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,-1,2,0,-1,2>,Eigen::Matrix<double,-1,-1,0,-1,-1>,0>const,Eigen::Product<Eigen::Matrix<double,-1,2,0,-1,2>,Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,-1,-1,0,-1,-1>const>const>>,0>const>const,Eigen::Product<Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>,0>const>>
  ::operator+(&local_5e0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,2,0,_1,2>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const,Eigen::Product<Eigen::Matrix<double,_1,2,0,_1,2>,Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>,0>const>const,Eigen::Product<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>,0>const>>
               *)&local_6a0,
              (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Reverse<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>_>_>,_0>_>
               *)&local_8a0);
  Eigen::
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>,_0>_>,_const_Eigen::Product<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_0>_>,_const_Eigen::Product<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Reverse<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>_>_>_>,_0>_>_>
  ::colwise(&local_4e0,
            (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>,_0>_>,_const_Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_0>_>,_const_Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Reverse<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>_>_>,_0>_>_>
             *)&local_5e0);
  Eigen::
  VectorwiseOp<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,-1,2,0,-1,2>,Eigen::Matrix<double,-1,-1,0,-1,-1>,0>const,Eigen::Product<Eigen::Matrix<double,-1,2,0,-1,2>,Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,-1,-1,0,-1,-1>const>const>>,0>const>const,Eigen::Product<Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>,0>const>const,Eigen::Product<Eigen::Matrix<double,-1,2,0,-1,2>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,-1,-1,0,-1,-1>const>const>const,Eigen::ArrayWrapper<Eigen::Reverse<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0>const>const>const>,0>const>const,0>
  ::operator+(&local_3e0,
              (VectorwiseOp<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,2,0,_1,2>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const,Eigen::Product<Eigen::Matrix<double,_1,2,0,_1,2>,Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>,0>const>const,Eigen::Product<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>,0>const>const,Eigen::Product<Eigen::Matrix<double,_1,2,0,_1,2>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const,Eigen::ArrayWrapper<Eigen::Reverse<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0>const>const>const>,0>const>const,0>
               *)&local_4e0,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->alpha_);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,2,0,_1,2>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const,Eigen::Product<Eigen::Matrix<double,_1,2,0,_1,2>,Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>,0>const>const,Eigen::Product<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>,0>const>const,Eigen::Product<Eigen::Matrix<double,_1,2,0,_1,2>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const,Eigen::ArrayWrapper<Eigen::Reverse<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0>const>const>const>,0>const>const,Eigen::Replicate<Eigen::Matrix<double,_1,1,0,_1,1>,1,_1>const>>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>,_0>_>,_const_Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_0>_>,_const_Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Reverse<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>_>_>,_0>_>,_const_Eigen::Replicate<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,__1>_>_>
              *)&local_3e0);
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd QuadO2::Global(const Eigen::MatrixXd& local) const {
  LF_VERIFY_MSG((0. <= local.array()).all() && (local.array() <= 1.).all(),
                "local coordinates out of bounds for reference element");

  auto local_squared = local.array().square();
  return ((beta_ * local) + (gamma_ * local_squared.matrix()) +
          (delta_ * local.row(0).cwiseProduct(local.row(1))) +
          (epsilon_ *
           (local_squared * local.colwise().reverse().array()).matrix()))
             .colwise() +
         alpha_;
}